

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::gen_index_which
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int forward,
          int count_only,vm_rcdesc *rc)

{
  int iVar1;
  size_t sVar2;
  vm_val_t *pvVar3;
  vm_val_t *in_RDX;
  vm_rcdesc *in_RDI;
  int in_R8D;
  int in_R9D;
  int val_cnt;
  size_t idx;
  size_t cnt;
  vm_val_t *func_val;
  undefined4 in_stack_ffffffffffffff88;
  vm_obj_id_t in_stack_ffffffffffffff8c;
  CVmRun *in_stack_ffffffffffffff90;
  size_t sVar4;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  vm_val_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  ulong local_48;
  
  if ((gen_index_which(unsigned_int,vm_val_t*,unsigned_int*,int,int,vm_rcdesc*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&gen_index_which(unsigned_int,vm_val_t*,unsigned_int*,int,int,vm_rcdesc*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&gen_index_which::desc,1);
    __cxa_guard_release(&gen_index_which(unsigned_int,vm_val_t*,unsigned_int*,int,int,vm_rcdesc*)::
                         desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)in_RDI,(uint *)in_stack_ffffffffffffff90,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar1 != 0) {
    return 1;
  }
  CVmStack::get(0);
  CVmRun::push_obj(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  vm_val_t::set_nil(in_RDX);
  iVar1 = 0;
  sVar2 = get_element_count((CVmObjVector *)0x34f56d);
  sVar4 = sVar2;
  local_48 = sVar2;
  if (in_R8D != 0) {
    sVar4 = 0;
    local_48 = 0;
  }
  do {
    if (in_R8D == 0) {
      if (local_48 == 0) goto LAB_0034f665;
    }
    else if (sVar2 <= local_48) goto LAB_0034f665;
    if (in_R8D == 0) {
      local_48 = local_48 - 1;
    }
    push_element((CVmObjVector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (size_t)in_RDI);
    CVmRun::call_func_ptr
              ((CVmRun *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa4,in_RDI,(uint)(sVar4 >> 0x20));
    pvVar3 = CVmRun::get_r0();
    if ((pvVar3->typ != VM_NIL) &&
       ((pvVar3 = CVmRun::get_r0(), pvVar3->typ != VM_INT ||
        (pvVar3 = CVmRun::get_r0(), (pvVar3->val).obj != 0)))) {
      if (in_R9D == 0) {
        vm_val_t::set_int(in_RDX,(int)local_48 + 1);
LAB_0034f665:
        CVmStack::discard(2);
        if (in_R9D == 0) {
          return 1;
        }
        vm_val_t::set_int(in_RDX,iVar1);
        return 1;
      }
      iVar1 = iVar1 + 1;
    }
    if (in_R8D != 0) {
      local_48 = local_48 + 1;
    }
  } while( true );
}

Assistant:

int CVmObjVector::gen_index_which(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc, int forward, int count_only,
                                  vm_rcdesc *rc)
{
    const vm_val_t *func_val;
    size_t cnt;
    size_t idx;
    int val_cnt;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* presume we won't find a matching element */
    retval->set_nil();
    val_cnt = 0;

    /* get the number of elements to visit */
    cnt = get_element_count();

    /* start at the first or last element, depending on direction */
    idx = (forward ? 0 : cnt);

    /*
     *   Go through each element of our vector, and invoke the callback on
     *   each element, looking for the first one that returns true.  
     */
    for (;;)
    {
        /* if we've reached the last element, we can stop looking */
        if (forward ? idx >= cnt : idx == 0)
            break;

        /* if we're going backwards, decrement the index */
        if (!forward)
            --idx;

        /* push the element as the callback's argument */
        push_element(vmg_ idx);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, rc, 0);

        /* 
         *   if the callback returned true, we've found the element we're
         *   looking for 
         */
        if (G_interpreter->get_r0()->typ == VM_NIL
            || (G_interpreter->get_r0()->typ == VM_INT
                && G_interpreter->get_r0()->val.intval == 0))
        {
            /* nil or zero - this one failed the test, so keep looking */
        }
        else
        {
            /* it passed the test - check what we're doing */
            if (count_only)
            {
                /* we only want the count */
                ++val_cnt;
            }
            else
            {
                /* we want the (1-based) index - return it */
                retval->set_int(idx + 1);
            
                /* found it - no need to keep looking */
                break;
            }
        }

        /* if we're going forwards, increment the index */
        if (forward)
            ++idx;
    }
    
    /* discard our gc protection (self) and our arguments */
    G_stk->discard(2);

    /* return the count if desired */
    if (count_only)
        retval->set_int(val_cnt);
    
    /* handled */
    return TRUE;
}